

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_DefineProperty(JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,JSValue getter,
                     JSValue setter,int flags)

{
  ushort uVar1;
  JSShape *pJVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  JSValue val_00;
  JSShapeProperty *prs_00;
  int iVar6;
  BOOL BVar7;
  int iVar8;
  JSRefCountHeader *p_1;
  JSValueUnion JVar9;
  uint uVar10;
  char *fmt;
  JSRefCountHeader *p_4;
  JSFloat64Union u;
  ulong uVar11;
  JSValueUnion *pr;
  uint uVar12;
  JSValueUnion JVar13;
  JSValue v;
  JSValue v_00;
  JSValue op1;
  JSValue v_01;
  JSValue v_02;
  JSValue this_obj_00;
  JSValue JVar14;
  JSValue val_01;
  JSValue new_val;
  JSValue val_02;
  JSValueUnion local_88;
  JSShapeProperty *prs;
  JSValueUnion local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint32_t array_length;
  int64_t local_48;
  JSValueUnion local_40;
  JSValueUnion JStack_38;
  
  local_68 = (JSValueUnion)val.tag;
  local_88 = val.u;
  local_48 = this_obj.tag;
  this_obj_00.u = this_obj.u;
  if ((int)this_obj.tag == -1) {
    local_5c = prop & 0x7fffffff;
    local_50 = (uint)flags >> 8;
    local_54 = (flags & local_50 | ~local_50) & 7 ^ 7;
    local_58 = flags & 0x1800;
    bVar4 = local_58 == 0;
    bVar5 = local_54 == 0;
    do {
      pJVar2 = *(JSShape **)((long)this_obj_00.u.ptr + 0x18);
      uVar10 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
LAB_0011b783:
      uVar12 = local_68._0_4_;
      if (uVar10 != 0) {
        uVar11 = (ulong)uVar10;
        prs = (JSShapeProperty *)(&pJVar2->proto + uVar11);
        if (*(JSAtom *)((long)&pJVar2->proto + uVar11 * 8 + 4) != prop) goto code_r0x0011b79b;
        pr = (JSValueUnion *)(*(JSProperty **)((long)this_obj_00.u.ptr + 0x20) + (uVar11 - 1));
        uVar10 = *(uint *)prs;
        if ((((uint)flags >> 0xd & 1) != 0) && ((uVar10 & 0x20000000) != 0)) {
          if (0xfffffff4 < uVar12) {
            *(int *)local_88.ptr = *local_88.ptr + 1;
          }
          JVar14.tag = (int64_t)local_68.ptr;
          JVar14.u.ptr = local_88.ptr;
          iVar6 = JS_ToArrayLengthFree(ctx,&array_length,JVar14,0);
          if (iVar6 != 0) {
            return -1;
          }
          JVar9 = (JSValueUnion)(long)(int)array_length;
          local_88.float64 = (double)array_length;
          if (-1 < (long)JVar9.ptr) {
            local_88 = JVar9;
          }
          local_68.float64 = 3.45845952088873e-323;
          if (-1 < (long)JVar9.ptr) {
            local_68.float64 = 0.0;
          }
          pJVar2 = *(JSShape **)((long)this_obj_00.u.ptr + 0x18);
          uVar10 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
          while( true ) {
            uVar11 = (ulong)uVar10;
            prs = (JSShapeProperty *)(&pJVar2->proto + uVar11);
            if (*(JSAtom *)((long)&pJVar2->proto + uVar11 * 8 + 4) == prop) break;
            uVar10 = *(uint *)prs & 0x3ffffff;
          }
          pr = (JSValueUnion *)(*(JSProperty **)((long)this_obj_00.u.ptr + 0x20) + (uVar11 - 1));
          uVar10 = *(uint *)prs;
        }
        prs_00 = prs;
        BVar7 = check_define_prop_flags(uVar10 >> 0x1a,flags);
        if (BVar7 == 0) {
LAB_0011bbed:
          iVar6 = JS_ThrowTypeErrorOrFalse(ctx,flags,"property is not configurable");
          return iVar6;
        }
        uVar12 = uVar10 >> 0x1a & 0xfffffff0;
        if (uVar12 != 0x30) {
          if ((flags & 0x3a00U) != 0) {
            if ((flags & 0x1800U) == 0) {
              if (uVar12 != 0x20) {
                if (uVar12 == 0x10) {
                  iVar6 = js_shape_prepare_update(ctx,(JSObject *)this_obj_00.u.ptr,&prs);
                  if (iVar6 != 0) {
                    return -1;
                  }
                  if (pr->ptr != (void *)0x0) {
                    v.tag = -1;
                    v.u.ptr = pr->ptr;
                    JS_FreeValue(ctx,v);
                  }
                  if (pr[1].ptr != (void *)0x0) {
                    v_00.tag = -1;
                    v_00.u.ptr = pr[1].ptr;
                    JS_FreeValue(ctx,v_00);
                  }
                  *(uint *)prs = *(uint *)prs & 0x37ffffff;
                  pr->int32 = 0;
                  pr[1].float64 = 1.48219693752374e-323;
                  uVar10 = *(uint *)prs;
                }
                else if ((((uint)flags >> 0xd & 1) != 0) && ((uVar10 & 0xc000000) == 0)) {
                  op1.tag = (int64_t)local_68.ptr;
                  op1.u.ptr = local_88.ptr;
                  BVar7 = js_same_value(ctx,op1,*(JSValue *)pr);
                  if (BVar7 != 0) {
                    return 1;
                  }
                  goto LAB_0011bbed;
                }
              }
              if ((uVar10 >> 0x1d & 1) != 0) {
                if (((uint)flags >> 0xd & 1) == 0) {
                  iVar6 = 1;
                }
                else {
                  if (0xfffffff4 < (uint)local_68.int32) {
                    *(int *)local_88.ptr = *local_88.ptr + 1;
                  }
                  val_02.tag = (int64_t)local_68.ptr;
                  val_02.u.ptr = local_88.ptr;
                  iVar6 = set_array_length(ctx,(JSObject *)this_obj_00.u.ptr,val_02,flags);
                }
                if ((flags & 0x202U) != 0x200) {
                  return iVar6;
                }
                prs = (JSShapeProperty *)(*(JSShape **)((long)this_obj_00.u.ptr + 0x18) + 1);
                iVar8 = js_update_property_flags
                                  (ctx,(JSObject *)this_obj_00.u.ptr,&prs,
                                   (uint)(*(JSShape **)((long)this_obj_00.u.ptr + 0x18))[1].header.
                                         ref_count >> 0x1a & 0xfffffffd);
                if (iVar8 == 0) {
                  return iVar6;
                }
                return -1;
              }
              if (((uint)flags >> 0xd & 1) != 0) {
                JS_FreeValue(ctx,*(JSValue *)pr);
                if (0xfffffff4 < (uint)local_68.int32) {
                  *(int *)local_88.ptr = *local_88.ptr + 1;
                }
                pr->ptr = (void *)local_88;
                pr[1] = local_68;
              }
              if ((((uint)flags >> 9 & 1) != 0) &&
                 (iVar6 = js_update_property_flags
                                    (ctx,(JSObject *)this_obj_00.u.ptr,&prs,
                                     flags & 2U | *(uint *)prs >> 0x1a & 0xfffffffd), iVar6 != 0)) {
                return -1;
              }
            }
            else {
              iVar6 = JS_IsFunction(ctx,getter);
              JVar9 = getter.u;
              if (iVar6 == 0) {
                JVar9.float64 = 0.0;
              }
              iVar6 = JS_IsFunction(ctx,setter);
              JVar13 = setter.u;
              if (iVar6 == 0) {
                JVar13.float64 = 0.0;
              }
              if ((uVar10 & 0xc0000000) == 0x40000000) {
                if (((uVar10 >> 0x1a & 1) == 0) &&
                   (((((uint)flags >> 0xb & 1) != 0 && (JVar9.ptr != pr->ptr)) ||
                    ((((uint)flags >> 0xc & 1) != 0 && (JVar13.ptr != pr[1].ptr))))))
                goto LAB_0011bbed;
              }
              else {
                iVar6 = js_shape_prepare_update(ctx,(JSObject *)this_obj_00.u.ptr,&prs);
                if (iVar6 != 0) {
                  return -1;
                }
                JS_FreeValue(ctx,*(JSValue *)pr);
                *(uint *)prs = *(uint *)prs & 0x17ffffff | 0x40000000;
                pr->float64 = 0.0;
                pr[1].float64 = 0.0;
              }
              if (((uint)flags >> 0xb & 1) != 0) {
                if (pr->ptr != (void *)0x0) {
                  v_01.tag = -1;
                  v_01.u.ptr = pr->ptr;
                  JS_FreeValue(ctx,v_01);
                }
                if ((JVar9.ptr != (void *)0x0) && (0xfffffff4 < (uint)getter.tag)) {
                  *(int *)getter.u.ptr = *getter.u.ptr + 1;
                }
                *pr = JVar9;
              }
              if (((uint)flags >> 0xc & 1) != 0) {
                if (pr[1].ptr != (void *)0x0) {
                  v_02.tag = -1;
                  v_02.u.ptr = pr[1].ptr;
                  JS_FreeValue(ctx,v_02);
                }
                if ((JVar13.ptr != (void *)0x0) && (0xfffffff4 < (uint)setter.tag)) {
                  *(int *)setter.u.ptr = *setter.u.ptr + 1;
                }
                pr[1] = JVar13;
              }
            }
          }
          iVar6 = js_update_property_flags
                            (ctx,(JSObject *)this_obj_00.u.ptr,&prs,
                             local_50 & (flags ^ *(uint *)prs >> 0x1a) & 5 ^ *(uint *)prs >> 0x1a);
          return -(uint)(iVar6 != 0) | 1;
        }
        iVar6 = JS_AutoInitProperty(ctx,(JSObject *)this_obj_00.u.ptr,prop,(JSProperty *)pr,prs_00);
        goto joined_r0x0011b8ba;
      }
      prs = (JSShapeProperty *)0x0;
      if ((*(byte *)((long)this_obj_00.u.ptr + 5) & 8) == 0) {
LAB_0011be13:
        val_01.tag = (int64_t)local_68.ptr;
        val_01.u.ptr = local_88.ptr;
        iVar6 = JS_CreateProperty(ctx,(JSObject *)this_obj_00.u.ptr,prop,val_01,getter,setter,flags)
        ;
        return iVar6;
      }
      uVar1 = *(ushort *)((long)this_obj_00.u.ptr + 6);
      if ((ulong)uVar1 != 2) {
        if (8 < (ushort)(uVar1 - 0x15)) goto LAB_0011be13;
        if ((int)prop < 0) {
          if (local_5c <
              ((anon_union_24_22_bbf4f0e3_for_u *)((long)this_obj_00.u.ptr + 0x30))->typed_array->
              length >> ("includes"[(ulong)uVar1 + 1] & 0x1fU)) {
            if (local_58 == 0 && local_54 == 0) {
              if (((uint)flags >> 0xd & 1) == 0) {
                return 1;
              }
              if (0xfffffff4 < uVar12) {
                *(int *)local_88.ptr = *local_88.ptr + 1;
              }
              local_40.float64 = local_88.float64;
              JStack_38 = local_68;
              val_00.tag = (int64_t)local_68.ptr;
              val_00.u.ptr = local_88.ptr;
              this_obj_00.tag = local_48;
              iVar6 = JS_SetPropertyValue(ctx,this_obj_00,(JSValue)ZEXT416(local_5c),val_00,flags);
              return iVar6;
            }
            fmt = "invalid descriptor flags";
            goto LAB_0011bfbc;
          }
        }
        else {
          JVar14 = JS_AtomIsNumericIndex1(ctx,prop);
          iVar6 = (int)JVar14.tag;
          if (iVar6 == 3) goto LAB_0011be13;
          if (iVar6 == 6) {
            return -1;
          }
          iVar8 = JS_NumberIsInteger(ctx,JVar14);
          if (iVar8 < 0) {
            JS_FreeValue(ctx,JVar14);
            return -1;
          }
          if (iVar8 == 0) {
            JS_FreeValue(ctx,JVar14);
            fmt = "non integer index in typed array";
            goto LAB_0011bfbc;
          }
          if (iVar6 == 7) {
            uVar10 = JVar14.u._4_4_ >> 0x1f;
          }
          else {
            uVar10 = 0;
            if (iVar6 == 0) {
              uVar10 = (uint)((ulong)JVar14.u.ptr >> 0x1f) & 1;
            }
          }
          JS_FreeValue(ctx,JVar14);
          if (uVar10 != 0) {
            fmt = "negative index in typed array";
            goto LAB_0011bfbc;
          }
        }
        fmt = "out-of-bound index in typed array";
LAB_0011bfbc:
        iVar6 = JS_ThrowTypeErrorOrFalse(ctx,flags,fmt);
        return iVar6;
      }
      if ((-1 < (int)prop) || (*(uint *)((long)this_obj_00.u.ptr + 0x40) <= local_5c))
      goto LAB_0011be13;
      if (bVar4 && bVar5) {
        if (((uint)flags >> 0xd & 1) != 0) {
          lVar3 = *(long *)((long)this_obj_00.u.ptr + 0x38);
          if (0xfffffff4 < uVar12) {
            *(int *)local_88.ptr = *local_88.ptr + 1;
          }
          new_val.tag = (int64_t)local_68.ptr;
          new_val.u.ptr = local_88.ptr;
          set_value(ctx,(JSValue *)((ulong)local_5c * 0x10 + lVar3),new_val);
          return 1;
        }
        return 1;
      }
      iVar6 = convert_fast_array_to_array(ctx,(JSObject *)this_obj_00.u.ptr);
joined_r0x0011b8ba:
    } while (iVar6 == 0);
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
  }
  return -1;
code_r0x0011b79b:
  uVar10 = *(uint *)prs & 0x3ffffff;
  goto LAB_0011b783;
}

Assistant:

int JS_DefineProperty(JSContext *ctx, JSValueConst this_obj,
                      JSAtom prop, JSValueConst val,
                      JSValueConst getter, JSValueConst setter, int flags)
{
    JSObject *p;
    JSShapeProperty *prs;
    JSProperty *pr;
    int mask, res;

    if (JS_VALUE_GET_TAG(this_obj) != JS_TAG_OBJECT) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    p = JS_VALUE_GET_OBJ(this_obj);

 redo_prop_update:
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        /* the range of the Array length property is always tested before */
        if ((prs->flags & JS_PROP_LENGTH) && (flags & JS_PROP_HAS_VALUE)) {
            uint32_t array_length;
            if (JS_ToArrayLengthFree(ctx, &array_length,
                                     JS_DupValue(ctx, val), FALSE)) {
                return -1;
            }
            /* this code relies on the fact that Uint32 are never allocated */
            val = (JSValueConst)JS_NewUint32(ctx, array_length);
            /* prs may have been modified */
            prs = find_own_property(&pr, p, prop);
            assert(prs != NULL);
        }
        /* property already exists */
        if (!check_define_prop_flags(prs->flags, flags)) {
        not_configurable:
            return JS_ThrowTypeErrorOrFalse(ctx, flags, "property is not configurable");
        }

        if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
            /* Instantiate property and retry */
            if (JS_AutoInitProperty(ctx, p, prop, pr, prs))
                return -1;
            goto redo_prop_update;
        }

        if (flags & (JS_PROP_HAS_VALUE | JS_PROP_HAS_WRITABLE |
                     JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
            if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
                JSObject *new_getter, *new_setter;

                if (JS_IsFunction(ctx, getter)) {
                    new_getter = JS_VALUE_GET_OBJ(getter);
                } else {
                    new_getter = NULL;
                }
                if (JS_IsFunction(ctx, setter)) {
                    new_setter = JS_VALUE_GET_OBJ(setter);
                } else {
                    new_setter = NULL;
                }

                if ((prs->flags & JS_PROP_TMASK) != JS_PROP_GETSET) {
                    if (js_shape_prepare_update(ctx, p, &prs))
                        return -1;
                    /* convert to getset */
                    if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                        free_var_ref(ctx->rt, pr->u.var_ref);
                    } else {
                        JS_FreeValue(ctx, pr->u.value);
                    }
                    prs->flags = (prs->flags &
                                  (JS_PROP_CONFIGURABLE | JS_PROP_ENUMERABLE)) |
                        JS_PROP_GETSET;
                    pr->u.getset.getter = NULL;
                    pr->u.getset.setter = NULL;
                } else {
                    if (!(prs->flags & JS_PROP_CONFIGURABLE)) {
                        if ((flags & JS_PROP_HAS_GET) &&
                            new_getter != pr->u.getset.getter) {
                            goto not_configurable;
                        }
                        if ((flags & JS_PROP_HAS_SET) &&
                            new_setter != pr->u.getset.setter) {
                            goto not_configurable;
                        }
                    }
                }
                if (flags & JS_PROP_HAS_GET) {
                    if (pr->u.getset.getter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.getter));
                    if (new_getter)
                        JS_DupValue(ctx, getter);
                    pr->u.getset.getter = new_getter;
                }
                if (flags & JS_PROP_HAS_SET) {
                    if (pr->u.getset.setter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.setter));
                    if (new_setter)
                        JS_DupValue(ctx, setter);
                    pr->u.getset.setter = new_setter;
                }
            } else {
                if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
                    /* convert to data descriptor */
                    if (js_shape_prepare_update(ctx, p, &prs))
                        return -1;
                    if (pr->u.getset.getter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.getter));
                    if (pr->u.getset.setter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.setter));
                    prs->flags &= ~(JS_PROP_TMASK | JS_PROP_WRITABLE);
                    pr->u.value = JS_UNDEFINED;
                } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                    /* Note: JS_PROP_VARREF is always writable */
                } else {
                    if ((prs->flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) == 0 &&
                        (flags & JS_PROP_HAS_VALUE)) {
                        if (!js_same_value(ctx, val, pr->u.value)) {
                            goto not_configurable;
                        } else {
                            return TRUE;
                        }
                    }
                }
                if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                    if (flags & JS_PROP_HAS_VALUE) {
                        if (p->class_id == JS_CLASS_MODULE_NS) {
                            /* JS_PROP_WRITABLE is always true for variable
                               references, but they are write protected in module name
                               spaces. */
                            if (!js_same_value(ctx, val, *pr->u.var_ref->pvalue))
                                goto not_configurable;
                        }
                        /* update the reference */
                        set_value(ctx, pr->u.var_ref->pvalue,
                                  JS_DupValue(ctx, val));
                    }
                    /* if writable is set to false, no longer a
                       reference (for mapped arguments) */
                    if ((flags & (JS_PROP_HAS_WRITABLE | JS_PROP_WRITABLE)) == JS_PROP_HAS_WRITABLE) {
                        JSValue val1;
                        if (js_shape_prepare_update(ctx, p, &prs))
                            return -1;
                        val1 = JS_DupValue(ctx, *pr->u.var_ref->pvalue);
                        free_var_ref(ctx->rt, pr->u.var_ref);
                        pr->u.value = val1;
                        prs->flags &= ~(JS_PROP_TMASK | JS_PROP_WRITABLE);
                    }
                } else if (prs->flags & JS_PROP_LENGTH) {
                    if (flags & JS_PROP_HAS_VALUE) {
                        /* Note: no JS code is executable because
                           'val' is guaranted to be a Uint32 */
                        res = set_array_length(ctx, p, JS_DupValue(ctx, val),
                                               flags);
                    } else {
                        res = TRUE;
                    }
                    /* still need to reset the writable flag if
                       needed.  The JS_PROP_LENGTH is kept because the
                       Uint32 test is still done if the length
                       property is read-only. */
                    if ((flags & (JS_PROP_HAS_WRITABLE | JS_PROP_WRITABLE)) ==
                        JS_PROP_HAS_WRITABLE) {
                        prs = get_shape_prop(p->shape);
                        if (js_update_property_flags(ctx, p, &prs,
                                                     prs->flags & ~JS_PROP_WRITABLE))
                            return -1;
                    }
                    return res;
                } else {
                    if (flags & JS_PROP_HAS_VALUE) {
                        JS_FreeValue(ctx, pr->u.value);
                        pr->u.value = JS_DupValue(ctx, val);
                    }
                    if (flags & JS_PROP_HAS_WRITABLE) {
                        if (js_update_property_flags(ctx, p, &prs,
                                                     (prs->flags & ~JS_PROP_WRITABLE) |
                                                     (flags & JS_PROP_WRITABLE)))
                            return -1;
                    }
                }
            }
        }
        mask = 0;
        if (flags & JS_PROP_HAS_CONFIGURABLE)
            mask |= JS_PROP_CONFIGURABLE;
        if (flags & JS_PROP_HAS_ENUMERABLE)
            mask |= JS_PROP_ENUMERABLE;
        if (js_update_property_flags(ctx, p, &prs,
                                     (prs->flags & ~mask) | (flags & mask)))
            return -1;
        return TRUE;
    }

    /* handle modification of fast array elements */
    if (p->fast_array) {
        uint32_t idx;
        uint32_t prop_flags;
        if (p->class_id == JS_CLASS_ARRAY) {
            if (__JS_AtomIsTaggedInt(prop)) {
                idx = __JS_AtomToUInt32(prop);
                if (idx < p->u.array.count) {
                    prop_flags = get_prop_flags(flags, JS_PROP_C_W_E);
                    if (prop_flags != JS_PROP_C_W_E)
                        goto convert_to_slow_array;
                    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
                    convert_to_slow_array:
                        if (convert_fast_array_to_array(ctx, p))
                            return -1;
                        else
                            goto redo_prop_update;
                    }
                    if (flags & JS_PROP_HAS_VALUE) {
                        set_value(ctx, &p->u.array.u.values[idx], JS_DupValue(ctx, val));
                    }
                    return TRUE;
                }
            }
        } else if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                   p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
            JSValue num;
            int ret;

            if (!__JS_AtomIsTaggedInt(prop)) {
                /* slow path with to handle all numeric indexes */
                num = JS_AtomIsNumericIndex1(ctx, prop);
                if (JS_IsUndefined(num))
                    goto typed_array_done;
                if (JS_IsException(num))
                    return -1;
                ret = JS_NumberIsInteger(ctx, num);
                if (ret < 0) {
                    JS_FreeValue(ctx, num);
                    return -1;
                }
                if (!ret) {
                    JS_FreeValue(ctx, num);
                    return JS_ThrowTypeErrorOrFalse(ctx, flags, "non integer index in typed array");
                }
                ret = JS_NumberIsNegativeOrMinusZero(ctx, num);
                JS_FreeValue(ctx, num);
                if (ret) {
                    return JS_ThrowTypeErrorOrFalse(ctx, flags, "negative index in typed array");
                }
                if (!__JS_AtomIsTaggedInt(prop))
                    goto typed_array_oob;
            }
            idx = __JS_AtomToUInt32(prop);
            /* if the typed array is detached, p->u.array.count = 0 */
            if (idx >= typed_array_get_length(ctx, p)) {
            typed_array_oob:
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound index in typed array");
            }
            prop_flags = get_prop_flags(flags, JS_PROP_ENUMERABLE | JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
            if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET) ||
                prop_flags != (JS_PROP_ENUMERABLE | JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE)) {
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "invalid descriptor flags");
            }
            if (flags & JS_PROP_HAS_VALUE) {
                return JS_SetPropertyValue(ctx, this_obj, JS_NewInt32(ctx, idx), JS_DupValue(ctx, val), flags);
            }
            return TRUE;
        typed_array_done: ;
        }
    }

    return JS_CreateProperty(ctx, p, prop, val, getter, setter, flags);
}